

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::log_message(ConsoleReporter *this,MessageData *mb)

{
  mutex *__mutex;
  Enum EVar1;
  ostream *poVar2;
  int iVar3;
  size_t sVar4;
  undefined8 uVar5;
  char *__s;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  __mutex = &this->mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar5 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  logTestStart(this);
  (*(this->super_IReporter)._vptr_IReporter[0xe])(this,mb->m_file,(ulong)(uint)mb->m_line," ");
  poVar2 = this->s;
  Color::operator<<(poVar2,(mb->m_severity & is_warn) * 4 + Red);
  EVar1 = mb->m_severity;
  if ((EVar1 & is_warn) == 0) {
    if ((EVar1 & is_check) == 0) {
      __s = "FATAL ERROR";
      if ((EVar1 & is_require) == 0) {
        __s = "";
      }
    }
    else {
      __s = "ERROR";
    }
  }
  else {
    __s = "MESSAGE";
  }
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  poVar2 = this->s;
  Color::operator<<(poVar2,None);
  doctest::operator<<(poVar2,&mb->m_string);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  log_contexts(this);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void log_message(const MessageData& mb) override {
            if(tc->m_no_output)
                return;

            std::lock_guard<std::mutex> lock(mutex);

            logTestStart();

            file_line_to_stream(mb.m_file, mb.m_line, " ");
            s << getSuccessOrFailColor(false, mb.m_severity)
              << getSuccessOrFailString(mb.m_severity & assertType::is_warn, mb.m_severity,
                                        "MESSAGE") << ": ";
            s << Color::None << mb.m_string << "\n";
            log_contexts();
        }